

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O1

FT_Error tt_face_load_any(TT_Face face,FT_ULong tag,FT_Long offset,FT_Byte *buffer,FT_ULong *length)

{
  FT_Error FVar1;
  TT_Table pTVar2;
  FT_ULong *pFVar3;
  FT_ULong count;
  TT_Table pTVar4;
  
  if (tag == 0) {
    pFVar3 = &((face->root).stream)->size;
  }
  else {
    if (face->num_tables != 0) {
      pTVar2 = face->dir_tables;
      pTVar4 = pTVar2 + face->num_tables;
      do {
        if ((pTVar2->Tag == tag) && (pTVar2->Length != 0)) goto LAB_0024865f;
        pTVar2 = pTVar2 + 1;
      } while (pTVar2 < pTVar4);
    }
    pTVar2 = (TT_Table)0x0;
LAB_0024865f:
    if (pTVar2 == (TT_Table)0x0) {
      return 0x8e;
    }
    offset = offset + pTVar2->Offset;
    pFVar3 = &pTVar2->Length;
  }
  count = *pFVar3;
  if ((length != (FT_ULong *)0x0) && (count = *length, *length == 0)) {
    *length = *pFVar3;
    return 0;
  }
  FVar1 = FT_Stream_ReadAt((face->root).stream,offset,buffer,count);
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_any( TT_Face    face,
                    FT_ULong   tag,
                    FT_Long    offset,
                    FT_Byte*   buffer,
                    FT_ULong*  length )
  {
    FT_Error   error;
    FT_Stream  stream;
    TT_Table   table;
    FT_ULong   size;


    if ( tag != 0 )
    {
      /* look for tag in font directory */
      table = tt_face_lookup_table( face, tag );
      if ( !table )
      {
        error = FT_THROW( Table_Missing );
        goto Exit;
      }

      offset += table->Offset;
      size    = table->Length;
    }
    else
      /* tag == 0 -- the user wants to access the font file directly */
      size = face->root.stream->size;

    if ( length && *length == 0 )
    {
      *length = size;

      return FT_Err_Ok;
    }

    if ( length )
      size = *length;

    stream = face->root.stream;
    /* the `if' is syntactic sugar for picky compilers */
    if ( FT_STREAM_READ_AT( offset, buffer, size ) )
      goto Exit;

  Exit:
    return error;
  }